

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereBoxCollisionAlgorithm.cpp
# Opt level: O3

cbtScalar __thiscall
cbtSphereBoxCollisionAlgorithm::getSpherePenetration
          (cbtSphereBoxCollisionAlgorithm *this,cbtVector3 *boxHalfExtent,cbtVector3 *sphereRelPos,
          cbtVector3 *closestPoint,cbtVector3 *normal)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = boxHalfExtent->m_floats[0] - sphereRelPos->m_floats[0];
  closestPoint->m_floats[0] = boxHalfExtent->m_floats[0];
  *(undefined1 (*) [16])normal->m_floats = SUB6416(ZEXT464(0x3f800000),0);
  fVar7 = boxHalfExtent->m_floats[0] + sphereRelPos->m_floats[0];
  if (fVar7 < fVar6) {
    uVar4 = *(undefined8 *)(sphereRelPos->m_floats + 2);
    *(undefined8 *)closestPoint->m_floats = *(undefined8 *)sphereRelPos->m_floats;
    *(undefined8 *)(closestPoint->m_floats + 2) = uVar4;
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(ZEXT416((uint)boxHalfExtent->m_floats[0]),auVar5);
    closestPoint->m_floats[0] = auVar5._0_4_;
    *(undefined1 (*) [16])normal->m_floats = SUB6416(ZEXT464(0xbf800000),0);
    fVar6 = fVar7;
  }
  fVar7 = boxHalfExtent->m_floats[1];
  fVar8 = sphereRelPos->m_floats[1];
  fVar1 = fVar7 - fVar8;
  if (fVar1 < fVar6) {
    uVar4 = *(undefined8 *)(sphereRelPos->m_floats + 2);
    *(undefined8 *)closestPoint->m_floats = *(undefined8 *)sphereRelPos->m_floats;
    *(undefined8 *)(closestPoint->m_floats + 2) = uVar4;
    closestPoint->m_floats[1] = boxHalfExtent->m_floats[1];
    normal->m_floats[0] = 0.0;
    normal->m_floats[1] = 1.0;
    normal->m_floats[2] = 0.0;
    normal->m_floats[3] = 0.0;
    fVar7 = boxHalfExtent->m_floats[1];
    fVar8 = sphereRelPos->m_floats[1];
    fVar6 = fVar1;
  }
  if (fVar7 + fVar8 < fVar6) {
    uVar4 = *(undefined8 *)(sphereRelPos->m_floats + 2);
    *(undefined8 *)closestPoint->m_floats = *(undefined8 *)sphereRelPos->m_floats;
    *(undefined8 *)(closestPoint->m_floats + 2) = uVar4;
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(ZEXT416((uint)boxHalfExtent->m_floats[1]),auVar2);
    closestPoint->m_floats[1] = auVar5._0_4_;
    normal->m_floats[0] = 0.0;
    normal->m_floats[1] = -1.0;
    normal->m_floats[2] = 0.0;
    normal->m_floats[3] = 0.0;
    fVar6 = fVar7 + fVar8;
  }
  fVar7 = boxHalfExtent->m_floats[2];
  fVar8 = sphereRelPos->m_floats[2];
  fVar1 = fVar7 - fVar8;
  if (fVar1 < fVar6) {
    uVar4 = *(undefined8 *)(sphereRelPos->m_floats + 2);
    *(undefined8 *)closestPoint->m_floats = *(undefined8 *)sphereRelPos->m_floats;
    *(undefined8 *)(closestPoint->m_floats + 2) = uVar4;
    closestPoint->m_floats[2] = boxHalfExtent->m_floats[2];
    normal->m_floats[0] = 0.0;
    normal->m_floats[1] = 0.0;
    normal->m_floats[2] = 1.0;
    normal->m_floats[3] = 0.0;
    fVar7 = boxHalfExtent->m_floats[2];
    fVar8 = sphereRelPos->m_floats[2];
    fVar6 = fVar1;
  }
  if (fVar7 + fVar8 < fVar6) {
    uVar4 = *(undefined8 *)(sphereRelPos->m_floats + 2);
    *(undefined8 *)closestPoint->m_floats = *(undefined8 *)sphereRelPos->m_floats;
    *(undefined8 *)(closestPoint->m_floats + 2) = uVar4;
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(ZEXT416((uint)boxHalfExtent->m_floats[2]),auVar3);
    closestPoint->m_floats[2] = auVar5._0_4_;
    normal->m_floats[0] = 0.0;
    normal->m_floats[1] = 0.0;
    normal->m_floats[2] = -1.0;
    normal->m_floats[3] = 0.0;
    fVar6 = fVar7 + fVar8;
  }
  return fVar6;
}

Assistant:

cbtScalar cbtSphereBoxCollisionAlgorithm::getSpherePenetration(cbtVector3 const& boxHalfExtent, cbtVector3 const& sphereRelPos, cbtVector3& closestPoint, cbtVector3& normal)
{
	//project the center of the sphere on the closest face of the box
	cbtScalar faceDist = boxHalfExtent.getX() - sphereRelPos.getX();
	cbtScalar minDist = faceDist;
	closestPoint.setX(boxHalfExtent.getX());
	normal.setValue(cbtScalar(1.0f), cbtScalar(0.0f), cbtScalar(0.0f));

	faceDist = boxHalfExtent.getX() + sphereRelPos.getX();
	if (faceDist < minDist)
	{
		minDist = faceDist;
		closestPoint = sphereRelPos;
		closestPoint.setX(-boxHalfExtent.getX());
		normal.setValue(cbtScalar(-1.0f), cbtScalar(0.0f), cbtScalar(0.0f));
	}

	faceDist = boxHalfExtent.getY() - sphereRelPos.getY();
	if (faceDist < minDist)
	{
		minDist = faceDist;
		closestPoint = sphereRelPos;
		closestPoint.setY(boxHalfExtent.getY());
		normal.setValue(cbtScalar(0.0f), cbtScalar(1.0f), cbtScalar(0.0f));
	}

	faceDist = boxHalfExtent.getY() + sphereRelPos.getY();
	if (faceDist < minDist)
	{
		minDist = faceDist;
		closestPoint = sphereRelPos;
		closestPoint.setY(-boxHalfExtent.getY());
		normal.setValue(cbtScalar(0.0f), cbtScalar(-1.0f), cbtScalar(0.0f));
	}

	faceDist = boxHalfExtent.getZ() - sphereRelPos.getZ();
	if (faceDist < minDist)
	{
		minDist = faceDist;
		closestPoint = sphereRelPos;
		closestPoint.setZ(boxHalfExtent.getZ());
		normal.setValue(cbtScalar(0.0f), cbtScalar(0.0f), cbtScalar(1.0f));
	}

	faceDist = boxHalfExtent.getZ() + sphereRelPos.getZ();
	if (faceDist < minDist)
	{
		minDist = faceDist;
		closestPoint = sphereRelPos;
		closestPoint.setZ(-boxHalfExtent.getZ());
		normal.setValue(cbtScalar(0.0f), cbtScalar(0.0f), cbtScalar(-1.0f));
	}

	return minDist;
}